

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall Shop::addNewMedicine(Shop *this)

{
  int quantity;
  int unitPrice;
  string name;
  string arrivalDate;
  string companyName;
  string expireDate;
  Medicine medicine;
  
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  companyName._M_dataplus._M_p = (pointer)&companyName.field_2;
  companyName._M_string_length = 0;
  companyName.field_2._M_local_buf[0] = '\0';
  arrivalDate._M_dataplus._M_p = (pointer)&arrivalDate.field_2;
  arrivalDate._M_string_length = 0;
  arrivalDate.field_2._M_local_buf[0] = '\0';
  expireDate._M_string_length = 0;
  expireDate.field_2._M_local_buf[0] = '\0';
  expireDate._M_dataplus._M_p = (pointer)&expireDate.field_2;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter Medicine Name:",0x14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::operator>>((istream *)&std::cin,(string *)&name);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter Medicine Company Name:",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::operator>>((istream *)&std::cin,(string *)&companyName);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Enter Unit Price:",0x11)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::istream::operator>>((istream *)&std::cin,&unitPrice);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter Arrival date:",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::operator>>((istream *)&std::cin,(string *)&arrivalDate);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter Expire date:",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::operator>>((istream *)&std::cin,(string *)&expireDate);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Enter Quantity:",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::istream::operator>>((istream *)&std::cin,&quantity);
  Medicine::Medicine(&medicine,
                     (int)((ulong)((long)(this->medicineList).
                                         super__Vector_base<Medicine,_std::allocator<Medicine>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->medicineList).
                                        super__Vector_base<Medicine,_std::allocator<Medicine>_>.
                                        _M_impl.super__Vector_impl_data._M_start) >> 4) * 0x38e38e39
                     + 1,unitPrice,quantity,false,&name,&companyName,&arrivalDate,&expireDate);
  std::vector<Medicine,_std::allocator<Medicine>_>::push_back(&this->medicineList,&medicine);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Added Medicine, New Medicines List is:",0x26);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  printMedicines(this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)medicine.expireDate._M_dataplus._M_p != &medicine.expireDate.field_2) {
    operator_delete(medicine.expireDate._M_dataplus._M_p,
                    medicine.expireDate.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)medicine.arrivalDate._M_dataplus._M_p != &medicine.arrivalDate.field_2) {
    operator_delete(medicine.arrivalDate._M_dataplus._M_p,
                    medicine.arrivalDate.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)medicine.companyName._M_dataplus._M_p != &medicine.companyName.field_2) {
    operator_delete(medicine.companyName._M_dataplus._M_p,
                    medicine.companyName.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)medicine.name._M_dataplus._M_p != &medicine.name.field_2) {
    operator_delete(medicine.name._M_dataplus._M_p,medicine.name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)expireDate._M_dataplus._M_p != &expireDate.field_2) {
    operator_delete(expireDate._M_dataplus._M_p,
                    CONCAT71(expireDate.field_2._M_allocated_capacity._1_7_,
                             expireDate.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)arrivalDate._M_dataplus._M_p != &arrivalDate.field_2) {
    operator_delete(arrivalDate._M_dataplus._M_p,
                    CONCAT71(arrivalDate.field_2._M_allocated_capacity._1_7_,
                             arrivalDate.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)companyName._M_dataplus._M_p != &companyName.field_2) {
    operator_delete(companyName._M_dataplus._M_p,
                    CONCAT71(companyName.field_2._M_allocated_capacity._1_7_,
                             companyName.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name._M_dataplus._M_p != &name.field_2) {
    operator_delete(name._M_dataplus._M_p,
                    CONCAT71(name.field_2._M_allocated_capacity._1_7_,name.field_2._M_local_buf[0])
                    + 1);
  }
  return;
}

Assistant:

void addNewMedicine() {
        string name, companyName, arrivalDate, expireDate;
        int unitPrice, quantity;
        cout << "Enter Medicine Name:" << endl;
        cin >> name;
        cout << "Enter Medicine Company Name:" << endl;
        cin >> companyName;
        cout << "Enter Unit Price:" << endl;
        cin >> unitPrice;
        cout << "Enter Arrival date:" << endl;
        cin >> arrivalDate;
        cout << "Enter Expire date:" << endl;
        cin >> expireDate;
        cout << "Enter Quantity:" << endl;
        cin >> quantity;

        Medicine medicine = Medicine(medicineList.size() + 1, unitPrice, quantity, false, name, companyName,
                                     arrivalDate, expireDate);

        medicineList.push_back(medicine);

        cout << "Added Medicine, New Medicines List is:" << endl;
        printMedicines();
    }